

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_tree.hpp
# Opt level: O2

ColumnSegment * __thiscall
duckdb::SegmentTree<duckdb::ColumnSegment,_false>::GetRootSegment
          (SegmentTree<duckdb::ColumnSegment,_false> *this)

{
  ColumnSegment *pCVar1;
  SegmentLock l;
  unique_lock<std::mutex> uStack_18;
  
  ::std::unique_lock<std::mutex>::unique_lock(&uStack_18,&this->node_lock);
  pCVar1 = GetRootSegmentInternal(this);
  ::std::unique_lock<std::mutex>::~unique_lock(&uStack_18);
  return pCVar1;
}

Assistant:

T *GetRootSegment() {
		auto l = Lock();
		return GetRootSegment(l);
	}